

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O0

void __thiscall
tcu::PixelBufferAccess::setPixel(PixelBufferAccess *this,Vec4 *color,int x,int y,int z)

{
  deUint32 dVar1;
  deUint32 dVar2;
  deUint32 dVar3;
  StorageType SVar4;
  StorageType SVar5;
  StorageType SVar6;
  deUint32 dVar7;
  int iVar8;
  deUint32 *ptr;
  uint *puVar9;
  int *piVar10;
  TextureSwizzle *pTVar11;
  float *pfVar12;
  int local_160;
  int c;
  int channelSize;
  Channel *map;
  int numChannels;
  Float<unsigned_int,_5,_6,_15,_2U> local_144;
  Vector<float,_4> local_140;
  undefined1 local_130 [8];
  IVec4 u_3;
  undefined1 local_110 [8];
  UVec4 u_2;
  Vec4 u_1;
  Vec4 u;
  undefined1 local_d0 [8];
  UVec4 swizzled_7;
  Vec4 swizzled_6;
  Vec4 swizzled_5;
  undefined1 local_90 [8];
  UVec4 swizzled_4;
  Vec4 swizzled_3;
  Vec4 swizzled_2;
  undefined1 local_50 [8];
  UVec4 swizzled_1;
  Vec4 swizzled;
  deUint8 *pixelPtr;
  int z_local;
  int y_local;
  int x_local;
  Vec4 *color_local;
  PixelBufferAccess *this_local;
  
  ptr = (deUint32 *)getPixelPtr(this,x,y,z);
  if ((this->super_ConstPixelBufferAccess).m_format.type == UNORM_INT8) {
    if (((this->super_ConstPixelBufferAccess).m_format.order == RGBA) ||
       ((this->super_ConstPixelBufferAccess).m_format.order == sRGBA)) {
      anon_unknown_75::writeRGBA8888Float((deUint8 *)ptr,color);
      return;
    }
    if (((this->super_ConstPixelBufferAccess).m_format.order == RGB) ||
       ((this->super_ConstPixelBufferAccess).m_format.order == sRGB)) {
      anon_unknown_75::writeRGB888Float((deUint8 *)ptr,color);
      return;
    }
  }
  switch((this->super_ConstPixelBufferAccess).m_format.type) {
  case UNORM_BYTE_44:
    pfVar12 = Vector<float,_4>::operator[](color,0);
    dVar7 = anon_unknown_75::unormFloatToChannel(*pfVar12,4);
    pfVar12 = Vector<float,_4>::operator[](color,1);
    dVar1 = anon_unknown_75::unormFloatToChannel(*pfVar12,4);
    *(byte *)ptr = (byte)(dVar7 << 4) | (byte)dVar1;
    break;
  case UNORM_SHORT_565:
    swizzleRB<float>((tcu *)(swizzled_1.m_data + 2),color,RGB,
                     (this->super_ConstPixelBufferAccess).m_format.order);
    pfVar12 = Vector<float,_4>::operator[]((Vector<float,_4> *)(swizzled_1.m_data + 2),0);
    dVar7 = anon_unknown_75::unormFloatToChannel(*pfVar12,5);
    pfVar12 = Vector<float,_4>::operator[]((Vector<float,_4> *)(swizzled_1.m_data + 2),1);
    dVar1 = anon_unknown_75::unormFloatToChannel(*pfVar12,6);
    pfVar12 = Vector<float,_4>::operator[]((Vector<float,_4> *)(swizzled_1.m_data + 2),2);
    dVar2 = anon_unknown_75::unormFloatToChannel(*pfVar12,5);
    *(ushort *)ptr = (ushort)(dVar7 << 0xb) | (ushort)(dVar1 << 5) | (ushort)dVar2;
    break;
  case UNORM_SHORT_555:
    swizzleRB<float>((tcu *)(swizzled_3.m_data + 2),color,RGB,
                     (this->super_ConstPixelBufferAccess).m_format.order);
    pfVar12 = Vector<float,_4>::operator[]((Vector<float,_4> *)(swizzled_3.m_data + 2),0);
    dVar7 = anon_unknown_75::unormFloatToChannel(*pfVar12,5);
    pfVar12 = Vector<float,_4>::operator[]((Vector<float,_4> *)(swizzled_3.m_data + 2),1);
    dVar1 = anon_unknown_75::unormFloatToChannel(*pfVar12,5);
    pfVar12 = Vector<float,_4>::operator[]((Vector<float,_4> *)(swizzled_3.m_data + 2),2);
    dVar2 = anon_unknown_75::unormFloatToChannel(*pfVar12,5);
    *(ushort *)ptr = (ushort)(dVar7 << 10) | (ushort)(dVar1 << 5) | (ushort)dVar2;
    break;
  case UNORM_SHORT_4444:
    swizzleRB<float>((tcu *)(swizzled_4.m_data + 2),color,RGBA,
                     (this->super_ConstPixelBufferAccess).m_format.order);
    pfVar12 = Vector<float,_4>::operator[]((Vector<float,_4> *)(swizzled_4.m_data + 2),0);
    dVar7 = anon_unknown_75::unormFloatToChannel(*pfVar12,4);
    pfVar12 = Vector<float,_4>::operator[]((Vector<float,_4> *)(swizzled_4.m_data + 2),1);
    dVar1 = anon_unknown_75::unormFloatToChannel(*pfVar12,4);
    pfVar12 = Vector<float,_4>::operator[]((Vector<float,_4> *)(swizzled_4.m_data + 2),2);
    dVar2 = anon_unknown_75::unormFloatToChannel(*pfVar12,4);
    pfVar12 = Vector<float,_4>::operator[]((Vector<float,_4> *)(swizzled_4.m_data + 2),3);
    dVar3 = anon_unknown_75::unormFloatToChannel(*pfVar12,4);
    *(ushort *)ptr =
         (ushort)(dVar7 << 0xc) | (ushort)(dVar1 << 8) | (ushort)(dVar2 << 4) | (ushort)dVar3;
    break;
  case UNORM_SHORT_5551:
    swizzleRB<float>((tcu *)(swizzled_6.m_data + 2),color,RGBA,
                     (this->super_ConstPixelBufferAccess).m_format.order);
    pfVar12 = Vector<float,_4>::operator[]((Vector<float,_4> *)(swizzled_6.m_data + 2),0);
    dVar7 = anon_unknown_75::unormFloatToChannel(*pfVar12,5);
    pfVar12 = Vector<float,_4>::operator[]((Vector<float,_4> *)(swizzled_6.m_data + 2),1);
    dVar1 = anon_unknown_75::unormFloatToChannel(*pfVar12,5);
    pfVar12 = Vector<float,_4>::operator[]((Vector<float,_4> *)(swizzled_6.m_data + 2),2);
    dVar2 = anon_unknown_75::unormFloatToChannel(*pfVar12,5);
    pfVar12 = Vector<float,_4>::operator[]((Vector<float,_4> *)(swizzled_6.m_data + 2),3);
    dVar3 = anon_unknown_75::unormFloatToChannel(*pfVar12,1);
    *(ushort *)ptr =
         (ushort)(dVar7 << 0xb) | (ushort)(dVar1 << 6) | (ushort)(dVar2 << 1) | (ushort)dVar3;
    break;
  case UNORM_SHORT_1555:
    Vector<float,_4>::swizzle((Vector<float,_4> *)(swizzled_7.m_data + 2),(int)color,3,0,1);
    pfVar12 = Vector<float,_4>::operator[]((Vector<float,_4> *)(swizzled_7.m_data + 2),0);
    dVar7 = anon_unknown_75::unormFloatToChannel(*pfVar12,1);
    pfVar12 = Vector<float,_4>::operator[]((Vector<float,_4> *)(swizzled_7.m_data + 2),1);
    dVar1 = anon_unknown_75::unormFloatToChannel(*pfVar12,5);
    pfVar12 = Vector<float,_4>::operator[]((Vector<float,_4> *)(swizzled_7.m_data + 2),2);
    dVar2 = anon_unknown_75::unormFloatToChannel(*pfVar12,5);
    pfVar12 = Vector<float,_4>::operator[]((Vector<float,_4> *)(swizzled_7.m_data + 2),3);
    dVar3 = anon_unknown_75::unormFloatToChannel(*pfVar12,5);
    *(ushort *)ptr =
         (ushort)(dVar7 << 0xf) | (ushort)(dVar1 << 10) | (ushort)(dVar2 << 5) | (ushort)dVar3;
    break;
  case UNORM_INT_101010:
    pfVar12 = Vector<float,_4>::operator[](color,0);
    dVar7 = anon_unknown_75::unormFloatToChannel(*pfVar12,10);
    pfVar12 = Vector<float,_4>::operator[](color,1);
    dVar1 = anon_unknown_75::unormFloatToChannel(*pfVar12,10);
    pfVar12 = Vector<float,_4>::operator[](color,2);
    dVar2 = anon_unknown_75::unormFloatToChannel(*pfVar12,10);
    *ptr = dVar7 << 0x16 | dVar1 << 0xc | dVar2 << 2;
    break;
  case SNORM_INT_1010102_REV:
    swizzleRB<float>((tcu *)(u_2.m_data + 2),color,RGBA,
                     (this->super_ConstPixelBufferAccess).m_format.order);
    pfVar12 = Vector<float,_4>::operator[]((Vector<float,_4> *)(u_2.m_data + 2),0);
    dVar7 = anon_unknown_75::snormFloatToChannel(*pfVar12,10);
    pfVar12 = Vector<float,_4>::operator[]((Vector<float,_4> *)(u_2.m_data + 2),1);
    dVar1 = anon_unknown_75::snormFloatToChannel(*pfVar12,10);
    pfVar12 = Vector<float,_4>::operator[]((Vector<float,_4> *)(u_2.m_data + 2),2);
    dVar2 = anon_unknown_75::snormFloatToChannel(*pfVar12,10);
    pfVar12 = Vector<float,_4>::operator[]((Vector<float,_4> *)(u_2.m_data + 2),3);
    dVar3 = anon_unknown_75::snormFloatToChannel(*pfVar12,2);
    *ptr = dVar7 | dVar1 << 10 | dVar2 << 0x14 | dVar3 << 0x1e;
    break;
  case UNORM_INT_1010102_REV:
    swizzleRB<float>((tcu *)(u_1.m_data + 2),color,RGBA,
                     (this->super_ConstPixelBufferAccess).m_format.order);
    pfVar12 = Vector<float,_4>::operator[]((Vector<float,_4> *)(u_1.m_data + 2),0);
    dVar7 = anon_unknown_75::unormFloatToChannel(*pfVar12,10);
    pfVar12 = Vector<float,_4>::operator[]((Vector<float,_4> *)(u_1.m_data + 2),1);
    dVar1 = anon_unknown_75::unormFloatToChannel(*pfVar12,10);
    pfVar12 = Vector<float,_4>::operator[]((Vector<float,_4> *)(u_1.m_data + 2),2);
    dVar2 = anon_unknown_75::unormFloatToChannel(*pfVar12,10);
    pfVar12 = Vector<float,_4>::operator[]((Vector<float,_4> *)(u_1.m_data + 2),3);
    dVar3 = anon_unknown_75::unormFloatToChannel(*pfVar12,2);
    *ptr = dVar7 | dVar1 << 10 | dVar2 << 0x14 | dVar3 << 0x1e;
    break;
  case UNSIGNED_BYTE_44:
    pfVar12 = Vector<float,_4>::operator[](color,0);
    dVar7 = anon_unknown_75::uintToChannel((deUint32)(long)*pfVar12,4);
    pfVar12 = Vector<float,_4>::operator[](color,1);
    dVar1 = anon_unknown_75::uintToChannel((deUint32)(long)*pfVar12,4);
    *(byte *)ptr = (byte)(dVar7 << 4) | (byte)dVar1;
    break;
  case UNSIGNED_SHORT_565:
    Vector<float,_4>::cast<unsigned_int>((Vector<float,_4> *)(swizzled_2.m_data + 2));
    swizzleRB<unsigned_int>
              ((tcu *)local_50,(Vector<unsigned_int,_4> *)(swizzled_2.m_data + 2),RGB,
               (this->super_ConstPixelBufferAccess).m_format.order);
    puVar9 = Vector<unsigned_int,_4>::operator[]((Vector<unsigned_int,_4> *)local_50,0);
    dVar7 = anon_unknown_75::uintToChannel(*puVar9,5);
    puVar9 = Vector<unsigned_int,_4>::operator[]((Vector<unsigned_int,_4> *)local_50,1);
    dVar1 = anon_unknown_75::uintToChannel(*puVar9,6);
    puVar9 = Vector<unsigned_int,_4>::operator[]((Vector<unsigned_int,_4> *)local_50,2);
    dVar2 = anon_unknown_75::uintToChannel(*puVar9,5);
    *(ushort *)ptr = (ushort)(dVar7 << 0xb) | (ushort)(dVar1 << 5) | (ushort)dVar2;
    break;
  case UNSIGNED_SHORT_4444:
    Vector<float,_4>::cast<unsigned_int>((Vector<float,_4> *)(swizzled_5.m_data + 2));
    swizzleRB<unsigned_int>
              ((tcu *)local_90,(Vector<unsigned_int,_4> *)(swizzled_5.m_data + 2),RGBA,
               (this->super_ConstPixelBufferAccess).m_format.order);
    puVar9 = Vector<unsigned_int,_4>::operator[]((Vector<unsigned_int,_4> *)local_90,0);
    dVar7 = anon_unknown_75::uintToChannel(*puVar9,4);
    puVar9 = Vector<unsigned_int,_4>::operator[]((Vector<unsigned_int,_4> *)local_90,1);
    dVar1 = anon_unknown_75::uintToChannel(*puVar9,4);
    puVar9 = Vector<unsigned_int,_4>::operator[]((Vector<unsigned_int,_4> *)local_90,2);
    dVar2 = anon_unknown_75::uintToChannel(*puVar9,4);
    puVar9 = Vector<unsigned_int,_4>::operator[]((Vector<unsigned_int,_4> *)local_90,3);
    dVar3 = anon_unknown_75::uintToChannel(*puVar9,4);
    *(ushort *)ptr =
         (ushort)(dVar7 << 0xc) | (ushort)(dVar1 << 8) | (ushort)(dVar2 << 4) | (ushort)dVar3;
    break;
  case UNSIGNED_SHORT_5551:
    Vector<float,_4>::cast<unsigned_int>((Vector<float,_4> *)(u.m_data + 2));
    swizzleRB<unsigned_int>
              ((tcu *)local_d0,(Vector<unsigned_int,_4> *)(u.m_data + 2),RGBA,
               (this->super_ConstPixelBufferAccess).m_format.order);
    puVar9 = Vector<unsigned_int,_4>::operator[]((Vector<unsigned_int,_4> *)local_d0,0);
    dVar7 = anon_unknown_75::uintToChannel(*puVar9,5);
    puVar9 = Vector<unsigned_int,_4>::operator[]((Vector<unsigned_int,_4> *)local_d0,1);
    dVar1 = anon_unknown_75::uintToChannel(*puVar9,5);
    puVar9 = Vector<unsigned_int,_4>::operator[]((Vector<unsigned_int,_4> *)local_d0,2);
    dVar2 = anon_unknown_75::uintToChannel(*puVar9,5);
    puVar9 = Vector<unsigned_int,_4>::operator[]((Vector<unsigned_int,_4> *)local_d0,3);
    dVar3 = anon_unknown_75::uintToChannel(*puVar9,1);
    *(ushort *)ptr =
         (ushort)(dVar7 << 0xb) | (ushort)(dVar1 << 6) | (ushort)(dVar2 << 1) | (ushort)dVar3;
    break;
  case SIGNED_INT_1010102_REV:
    Vector<float,_4>::cast<int>(&local_140);
    swizzleRB<int>((tcu *)local_130,(Vector<int,_4> *)&local_140,RGBA,
                   (this->super_ConstPixelBufferAccess).m_format.order);
    piVar10 = Vector<int,_4>::operator[]((Vector<int,_4> *)local_130,0);
    dVar7 = anon_unknown_75::intToChannel(*piVar10,10);
    piVar10 = Vector<int,_4>::operator[]((Vector<int,_4> *)local_130,1);
    dVar1 = anon_unknown_75::intToChannel(*piVar10,10);
    piVar10 = Vector<int,_4>::operator[]((Vector<int,_4> *)local_130,2);
    dVar2 = anon_unknown_75::intToChannel(*piVar10,10);
    piVar10 = Vector<int,_4>::operator[]((Vector<int,_4> *)local_130,3);
    dVar3 = anon_unknown_75::intToChannel(*piVar10,2);
    *ptr = dVar7 | dVar1 << 10 | dVar2 << 0x14 | dVar3 << 0x1e;
    break;
  case UNSIGNED_INT_1010102_REV:
    Vector<float,_4>::cast<unsigned_int>((Vector<float,_4> *)(u_3.m_data + 2));
    swizzleRB<unsigned_int>
              ((tcu *)local_110,(Vector<unsigned_int,_4> *)(u_3.m_data + 2),RGBA,
               (this->super_ConstPixelBufferAccess).m_format.order);
    puVar9 = Vector<unsigned_int,_4>::operator[]((Vector<unsigned_int,_4> *)local_110,0);
    dVar7 = anon_unknown_75::uintToChannel(*puVar9,10);
    puVar9 = Vector<unsigned_int,_4>::operator[]((Vector<unsigned_int,_4> *)local_110,1);
    dVar1 = anon_unknown_75::uintToChannel(*puVar9,10);
    puVar9 = Vector<unsigned_int,_4>::operator[]((Vector<unsigned_int,_4> *)local_110,2);
    dVar2 = anon_unknown_75::uintToChannel(*puVar9,10);
    puVar9 = Vector<unsigned_int,_4>::operator[]((Vector<unsigned_int,_4> *)local_110,3);
    dVar3 = anon_unknown_75::uintToChannel(*puVar9,2);
    *ptr = dVar7 | dVar1 << 10 | dVar2 << 0x14 | dVar3 << 0x1e;
    break;
  case UNSIGNED_INT_11F_11F_10F_REV:
    pfVar12 = Vector<float,_4>::operator[](color,0);
    Float<unsigned_int,_5,_6,_15,_2U>::Float(&local_144,*pfVar12);
    SVar4 = Float<unsigned_int,_5,_6,_15,_2U>::bits(&local_144);
    pfVar12 = Vector<float,_4>::operator[](color,1);
    Float<unsigned_int,_5,_6,_15,_2U>::Float
              ((Float<unsigned_int,_5,_6,_15,_2U> *)&numChannels,*pfVar12);
    SVar5 = Float<unsigned_int,_5,_6,_15,_2U>::bits
                      ((Float<unsigned_int,_5,_6,_15,_2U> *)&numChannels);
    pfVar12 = Vector<float,_4>::operator[](color,2);
    Float<unsigned_int,_5,_5,_15,_2U>::Float
              ((Float<unsigned_int,_5,_5,_15,_2U> *)((long)&map + 4),*pfVar12);
    SVar6 = Float<unsigned_int,_5,_5,_15,_2U>::bits
                      ((Float<unsigned_int,_5,_5,_15,_2U> *)((long)&map + 4));
    *ptr = SVar4 | SVar5 << 0xb | SVar6 << 0x16;
    break;
  case UNSIGNED_INT_999_E5_REV:
    dVar7 = packRGB999E5(color);
    *ptr = dVar7;
    break;
  default:
    map._0_4_ = getNumUsedChannels((this->super_ConstPixelBufferAccess).m_format.order);
    pTVar11 = getChannelWriteSwizzle((this->super_ConstPixelBufferAccess).m_format.order);
    iVar8 = getChannelSize((this->super_ConstPixelBufferAccess).m_format.type);
    for (local_160 = 0; local_160 < (int)map; local_160 = local_160 + 1) {
      pfVar12 = Vector<float,_4>::operator[](color,pTVar11->components[local_160]);
      anon_unknown_75::floatToChannel
                ((byte *)((long)ptr + (long)(iVar8 * local_160)),*pfVar12,
                 (this->super_ConstPixelBufferAccess).m_format.type);
    }
  }
  return;
}

Assistant:

void PixelBufferAccess::setPixel (const Vec4& color, int x, int y, int z) const
{
	DE_ASSERT(de::inBounds(x, 0, getWidth()));
	DE_ASSERT(de::inBounds(y, 0, getHeight()));
	DE_ASSERT(de::inBounds(z, 0, getDepth()));
	DE_ASSERT(!isCombinedDepthStencilType(m_format.type)); // combined types cannot be accessed directly
	DE_ASSERT(m_format.order != TextureFormat::DS); // combined formats cannot be accessed directly

	deUint8* const pixelPtr = (deUint8*)getPixelPtr(x, y, z);

	// Optimized fomats.
	if (m_format.type == TextureFormat::UNORM_INT8)
	{
		if (m_format.order == TextureFormat::RGBA || m_format.order == TextureFormat::sRGBA)
		{
			writeRGBA8888Float(pixelPtr, color);
			return;
		}
		else if (m_format.order == TextureFormat::RGB || m_format.order == TextureFormat::sRGB)
		{
			writeRGB888Float(pixelPtr, color);
			return;
		}
	}

#define PN(VAL, OFFS, BITS)		(unormFloatToChannel((VAL), (BITS)) << (OFFS))
#define PS(VAL, OFFS, BITS)		(snormFloatToChannel((VAL), (BITS)) << (OFFS))
#define PU(VAL, OFFS, BITS)		(uintToChannel((VAL), (BITS)) << (OFFS))
#define PI(VAL, OFFS, BITS)		(intToChannel((VAL), (BITS)) << (OFFS))

	switch (m_format.type)
	{
		case TextureFormat::UNORM_BYTE_44:		*((deUint8 *)pixelPtr) = (deUint8)(PN(color[0], 4, 4) | PN(color[1], 0, 4));						break;
		case TextureFormat::UNSIGNED_BYTE_44:	*((deUint8 *)pixelPtr) = (deUint8)(PU((deUint32)color[0], 4, 4) | PU((deUint32)color[1], 0, 4));	break;
		case TextureFormat::UNORM_INT_101010:	*((deUint32*)pixelPtr) = PN(color[0], 22, 10) | PN(color[1], 12, 10) | PN(color[2], 2, 10);			break;

		case TextureFormat::UNORM_SHORT_565:
		{
			const Vec4 swizzled = swizzleRB(color, TextureFormat::RGB, m_format.order);
			*((deUint16*)pixelPtr) = (deUint16)(PN(swizzled[0], 11, 5) | PN(swizzled[1], 5, 6) | PN(swizzled[2], 0, 5));
			break;
		}

		case TextureFormat::UNSIGNED_SHORT_565:
		{
			const UVec4 swizzled = swizzleRB(color.cast<deUint32>(), TextureFormat::RGB, m_format.order);
			*((deUint16*)pixelPtr) = (deUint16)(PU(swizzled[0], 11, 5) | PU(swizzled[1], 5, 6) | PU(swizzled[2], 0, 5));
			break;
		}

		case TextureFormat::UNORM_SHORT_555:
		{
			const Vec4 swizzled = swizzleRB(color, TextureFormat::RGB, m_format.order);
			*((deUint16*)pixelPtr) = (deUint16)(PN(swizzled[0], 10, 5) | PN(swizzled[1], 5, 5) | PN(swizzled[2], 0, 5));
			break;
		}

		case TextureFormat::UNORM_SHORT_4444:
		{
			const Vec4 swizzled = swizzleRB(color, TextureFormat::RGBA, m_format.order);
			*((deUint16*)pixelPtr) = (deUint16)(PN(swizzled[0], 12, 4) | PN(swizzled[1], 8, 4) | PN(swizzled[2], 4, 4) | PN(swizzled[3], 0, 4));
			break;
		}

		case TextureFormat::UNSIGNED_SHORT_4444:
		{
			const UVec4 swizzled = swizzleRB(color.cast<deUint32>(), TextureFormat::RGBA, m_format.order);
			*((deUint16*)pixelPtr) = (deUint16)(PU(swizzled[0], 12, 4) | PU(swizzled[1], 8, 4) | PU(swizzled[2], 4, 4) | PU(swizzled[3], 0, 4));
			break;
		}

		case TextureFormat::UNORM_SHORT_5551:
		{
			const Vec4 swizzled = swizzleRB(color, TextureFormat::RGBA, m_format.order);
			*((deUint16*)pixelPtr) = (deUint16)(PN(swizzled[0], 11, 5) | PN(swizzled[1], 6, 5) | PN(swizzled[2], 1, 5) | PN(swizzled[3], 0, 1));
			break;
		}

		case TextureFormat::UNORM_SHORT_1555:
		{
			const Vec4 swizzled = color.swizzle(3,0,1,2); // RGBA -> ARGB
			*((deUint16*)pixelPtr) = (deUint16)(PN(swizzled[0], 15, 1) | PN(swizzled[1], 10, 5) | PN(swizzled[2], 5, 5) | PN(swizzled[3], 0, 5));
			break;
		}

		case TextureFormat::UNSIGNED_SHORT_5551:
		{
			const UVec4 swizzled = swizzleRB(color.cast<deUint32>(), TextureFormat::RGBA, m_format.order);
			*((deUint16*)pixelPtr) = (deUint16)(PU(swizzled[0], 11, 5) | PU(swizzled[1], 6, 5) | PU(swizzled[2], 1, 5) | PU(swizzled[3], 0, 1));
			break;
		}

		case TextureFormat::UNORM_INT_1010102_REV:
		{
			const Vec4 u = swizzleRB(color, TextureFormat::RGBA, m_format.order);
			*((deUint32*)pixelPtr) = PN(u[0], 0, 10) | PN(u[1], 10, 10) | PN(u[2], 20, 10) | PN(u[3], 30, 2);
			break;
		}

		case TextureFormat::SNORM_INT_1010102_REV:
		{
			const Vec4 u = swizzleRB(color, TextureFormat::RGBA, m_format.order);
			*((deUint32*)pixelPtr) = PS(u[0], 0, 10) | PS(u[1], 10, 10) | PS(u[2], 20, 10) | PS(u[3], 30, 2);
			break;
		}

		case TextureFormat::UNSIGNED_INT_1010102_REV:
		{
			const UVec4 u = swizzleRB(color.cast<deUint32>(), TextureFormat::RGBA, m_format.order);
			*((deUint32*)pixelPtr) = PU(u[0], 0, 10) | PU(u[1], 10, 10) | PU(u[2], 20, 10) | PU(u[3], 30, 2);
			break;
		}

		case TextureFormat::SIGNED_INT_1010102_REV:
		{
			const IVec4 u = swizzleRB(color.cast<deInt32>(), TextureFormat::RGBA, m_format.order);
			*((deUint32*)pixelPtr) = PI(u[0], 0, 10) | PI(u[1], 10, 10) | PI(u[2], 20, 10) | PI(u[3], 30, 2);
			break;
		}

		case TextureFormat::UNSIGNED_INT_11F_11F_10F_REV:
			*((deUint32*)pixelPtr) = Float11(color[0]).bits() | (Float11(color[1]).bits() << 11) | (Float10(color[2]).bits() << 22);
			break;

		case TextureFormat::UNSIGNED_INT_999_E5_REV:
			*((deUint32*)pixelPtr) = packRGB999E5(color);
			break;

		default:
		{
			// Generic path.
			int								numChannels	= getNumUsedChannels(m_format.order);
			const TextureSwizzle::Channel*	map			= getChannelWriteSwizzle(m_format.order).components;
			int								channelSize	= getChannelSize(m_format.type);

			for (int c = 0; c < numChannels; c++)
			{
				DE_ASSERT(deInRange32(map[c], TextureSwizzle::CHANNEL_0, TextureSwizzle::CHANNEL_3));
				floatToChannel(pixelPtr + channelSize*c, color[map[c]], m_format.type);
			}
			break;
		}
	}

#undef PN
#undef PS
#undef PU
#undef PI
}